

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_transaction.cpp
# Opt level: O2

void cfd::api::json::TransactionJsonApi::DecodeRawTransaction
               (DecodeRawTransactionRequest *request,DecodeRawTransactionResponse *response)

{
  Script *object;
  pointer pAVar1;
  undefined8 uVar2;
  bool bVar3;
  NetType type;
  uint32_t uVar4;
  CfdException *pCVar5;
  pointer object_00;
  JsonClassBase<cfd::api::json::DecodeLockingScript> this;
  pointer pTVar6;
  _func_int **pp_Var7;
  int64_t require_num;
  string script_type;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> addr_list;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> local_488;
  Transaction tx;
  Script locking_script;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addresses;
  DecodeRawTransactionTxIn res_txin;
  DecodeRawTransactionTxOut res_txout;
  string local_158;
  DecodeLockingScript script_pub_key_res;
  AddressFactory addr_factory;
  string local_50;
  
  if (request == (DecodeRawTransactionRequest *)0x0) {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&res_txin,"request is null.",(allocator *)&res_txout);
    core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&res_txin);
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (response != (DecodeRawTransactionResponse *)0x0) {
    std::__cxx11::string::string((string *)&local_158,(string *)&request->hex_);
    if (local_158._M_string_length != 0) {
      std::__cxx11::string::string((string *)&res_txin,(string *)&request->network_);
      type = ConvertNetType((string *)&res_txin);
      std::__cxx11::string::~string((string *)&res_txin);
      core::Transaction::Transaction(&tx,&local_158);
      core::AbstractTransaction::GetTxid((Txid *)&res_txout,&tx.super_AbstractTransaction);
      core::Txid::GetHex_abi_cxx11_((string *)&res_txin,(Txid *)&res_txout);
      std::__cxx11::string::_M_assign((string *)&response->txid_);
      std::__cxx11::string::~string((string *)&res_txin);
      core::Txid::~Txid((Txid *)&res_txout);
      core::AbstractTransaction::GetWitnessHash
                ((ByteData256 *)&script_pub_key_res,&tx.super_AbstractTransaction);
      core::Txid::Txid((Txid *)&res_txout,(ByteData256 *)&script_pub_key_res);
      core::Txid::GetHex_abi_cxx11_((string *)&res_txin,(Txid *)&res_txout);
      std::__cxx11::string::_M_assign((string *)&response->hash_);
      std::__cxx11::string::~string((string *)&res_txin);
      core::Txid::~Txid((Txid *)&res_txout);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script_pub_key_res)
      ;
      uVar4 = core::Transaction::GetTotalSize(&tx);
      response->size_ = uVar4;
      uVar4 = core::Transaction::GetVsize(&tx);
      response->vsize_ = uVar4;
      uVar4 = core::Transaction::GetWeight(&tx);
      response->weight_ = uVar4;
      uVar4 = core::AbstractTransaction::GetVersion(&tx.super_AbstractTransaction);
      response->version_ = uVar4;
      uVar4 = core::AbstractTransaction::GetLockTime(&tx.super_AbstractTransaction);
      response->locktime_ = uVar4;
      core::Transaction::GetTxInList
                ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
                 &locking_script,&tx);
      for (pp_Var7 = locking_script._vptr_Script;
          pp_Var7 !=
          (_func_int **)
          locking_script.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start; pp_Var7 = pp_Var7 + 0x12) {
        DecodeRawTransactionTxIn::DecodeRawTransactionTxIn(&res_txin);
        bVar3 = core::AbstractTransaction::IsCoinBase(&tx.super_AbstractTransaction);
        if (bVar3) {
          std::__cxx11::string::string((string *)&res_txout,"txid",(allocator *)&script_pub_key_res)
          ;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&res_txin.ignore_items,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res_txout
                    );
          std::__cxx11::string::~string((string *)&res_txout);
          std::__cxx11::string::string((string *)&res_txout,"vout",(allocator *)&script_pub_key_res)
          ;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&res_txin.ignore_items,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res_txout
                    );
          std::__cxx11::string::~string((string *)&res_txout);
          std::__cxx11::string::string
                    ((string *)&res_txout,"scriptSig",(allocator *)&script_pub_key_res);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&res_txin.ignore_items,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res_txout
                    );
          std::__cxx11::string::~string((string *)&res_txout);
          std::__cxx11::string::string
                    ((string *)&res_txout,"txinwitness",(allocator *)&script_pub_key_res);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&res_txin.ignore_items,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res_txout
                    );
          std::__cxx11::string::~string((string *)&res_txout);
          core::Script::Script((Script *)&res_txout,(Script *)(pp_Var7 + 6));
          bVar3 = core::Script::IsEmpty((Script *)&res_txout);
          core::Script::~Script((Script *)&res_txout);
          if (!bVar3) {
            core::Script::Script((Script *)&res_txout,(Script *)(pp_Var7 + 6));
            core::Script::GetHex_abi_cxx11_((string *)&script_pub_key_res,(Script *)&res_txout);
            std::__cxx11::string::_M_assign((string *)&res_txin.coinbase_);
            std::__cxx11::string::~string((string *)&script_pub_key_res);
            core::Script::~Script((Script *)&res_txout);
          }
        }
        else {
          std::__cxx11::string::string
                    ((string *)&res_txout,"coinbase",(allocator *)&script_pub_key_res);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&res_txin.ignore_items,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res_txout
                    );
          std::__cxx11::string::~string((string *)&res_txout);
          core::Txid::Txid((Txid *)&script_pub_key_res,(Txid *)(pp_Var7 + 1));
          core::Txid::GetHex_abi_cxx11_((string *)&res_txout,(Txid *)&script_pub_key_res);
          std::__cxx11::string::_M_assign((string *)&res_txin.txid_);
          std::__cxx11::string::~string((string *)&res_txout);
          core::Txid::~Txid((Txid *)&script_pub_key_res);
          res_txin.vout_ = *(uint32_t *)(pp_Var7 + 5);
          object = (Script *)(pp_Var7 + 6);
          core::Script::Script((Script *)&res_txout,object);
          bVar3 = core::Script::IsEmpty((Script *)&res_txout);
          core::Script::~Script((Script *)&res_txout);
          if (!bVar3) {
            core::Script::Script((Script *)&res_txout,object);
            core::Script::ToString_abi_cxx11_((string *)&script_pub_key_res,(Script *)&res_txout);
            std::__cxx11::string::_M_assign((string *)&res_txin.script_sig_.asm__);
            std::__cxx11::string::~string((string *)&script_pub_key_res);
            core::Script::~Script((Script *)&res_txout);
            core::Script::Script((Script *)&res_txout,object);
            core::Script::GetHex_abi_cxx11_((string *)&script_pub_key_res,(Script *)&res_txout);
            std::__cxx11::string::_M_assign((string *)&res_txin.script_sig_.hex_);
            std::__cxx11::string::~string((string *)&script_pub_key_res);
            core::Script::~Script((Script *)&res_txout);
          }
          core::ScriptWitness::ScriptWitness
                    ((ScriptWitness *)&res_txout,(ScriptWitness *)(pp_Var7 + 0xe));
          core::ScriptWitness::GetWitness
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                     &script_pub_key_res,(ScriptWitness *)&res_txout);
          core::ScriptWitness::~ScriptWitness((ScriptWitness *)&res_txout);
          uVar2 = script_pub_key_res.ignore_items._M_t._M_impl._0_8_;
          for (this = script_pub_key_res.super_JsonClassBase<cfd::api::json::DecodeLockingScript>;
              this._vptr_JsonClassBase != (_func_int **)uVar2;
              this._vptr_JsonClassBase = this._vptr_JsonClassBase + 0x18) {
            core::ByteData::GetHex_abi_cxx11_
                      ((string *)&res_txout,(ByteData *)this._vptr_JsonClassBase);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &res_txin.txinwitness_.
                        super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &res_txout);
            std::__cxx11::string::~string((string *)&res_txout);
          }
          std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                     &script_pub_key_res);
          if (res_txin.txinwitness_.
              super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              res_txin.txinwitness_.
              super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::__cxx11::string::string
                      ((string *)&res_txout,"txinwitness",(allocator *)&script_pub_key_res);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&res_txin.ignore_items,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &res_txout);
            std::__cxx11::string::~string((string *)&res_txout);
          }
        }
        res_txin.sequence_ = *(uint32_t *)(pp_Var7 + 0xd);
        std::
        vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
        ::push_back(&(response->vin_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxIn>.
                     super_vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
                    ,&res_txin);
        DecodeRawTransactionTxIn::~DecodeRawTransactionTxIn(&res_txin);
      }
      std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
                ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
                 &locking_script);
      core::Transaction::GetTxOutList(&local_488,&tx);
      uVar4 = 0;
      for (pTVar6 = local_488.
                    super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pTVar6 != local_488.
                    super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pTVar6 = pTVar6 + 1) {
        DecodeRawTransactionTxOut::DecodeRawTransactionTxOut(&res_txout);
        res_txin.super_JsonClassBase<cfd::api::json::DecodeRawTransactionTxIn>._vptr_JsonClassBase =
             (_func_int **)(pTVar6->super_AbstractTxOutReference).value_.amount_;
        res_txin.ignore_items._M_t._M_impl._0_1_ =
             (pTVar6->super_AbstractTxOutReference).value_.ignore_check_;
        res_txout.value_ = core::Amount::GetSatoshiValue((Amount *)&res_txin);
        res_txout.n_ = uVar4;
        DecodeLockingScript::DecodeLockingScript(&script_pub_key_res);
        addresses.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        addresses.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        addresses.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        core::Script::Script
                  (&locking_script,&(pTVar6->super_AbstractTxOutReference).locking_script_);
        core::Script::GetHex_abi_cxx11_((string *)&res_txin,&locking_script);
        std::__cxx11::string::_M_assign((string *)&script_pub_key_res.hex_);
        std::__cxx11::string::~string((string *)&res_txin);
        core::Script::ToString_abi_cxx11_((string *)&res_txin,&locking_script);
        std::__cxx11::string::_M_assign((string *)&script_pub_key_res.asm__);
        std::__cxx11::string::~string((string *)&res_txin);
        AddressFactory::AddressFactory(&addr_factory,type);
        require_num = 0;
        script_type._M_dataplus._M_p = (pointer)&script_type.field_2;
        script_type._M_string_length = 0;
        script_type.field_2._M_local_buf[0] = '\0';
        ConvertFromLockingScript(&addr_list,&addr_factory,&locking_script,&script_type,&require_num)
        ;
        std::__cxx11::string::_M_assign((string *)&script_pub_key_res.type_);
        pAVar1 = addr_list.
                 super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        script_pub_key_res.req_sigs_ = (int)require_num;
        object_00 = addr_list.
                    super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        if (addr_list.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            addr_list.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string((string *)&res_txin,"reqSigs",(allocator *)&local_50);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&script_pub_key_res.ignore_items,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res_txin)
          ;
          std::__cxx11::string::~string((string *)&res_txin);
          std::__cxx11::string::string((string *)&res_txin,"addresses",(allocator *)&local_50);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&script_pub_key_res.ignore_items,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res_txin)
          ;
          std::__cxx11::string::~string((string *)&res_txin);
        }
        else {
          for (; object_00 != pAVar1; object_00 = object_00 + 1) {
            core::Address::Address((Address *)&res_txin,object_00);
            core::Address::GetAddress_abi_cxx11_(&local_50,(Address *)&res_txin);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &script_pub_key_res.addresses_.
                        super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            core::Address::~Address((Address *)&res_txin);
          }
        }
        DecodeLockingScript::operator=(&res_txout.script_pub_key_,&script_pub_key_res);
        std::
        vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
        ::push_back(&(response->vout_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxOut>.
                     super_vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
                    ,&res_txout);
        uVar4 = uVar4 + 1;
        std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector(&addr_list);
        std::__cxx11::string::~string((string *)&script_type);
        AddressFactory::~AddressFactory(&addr_factory);
        core::Script::~Script(&locking_script);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&addresses);
        DecodeLockingScript::~DecodeLockingScript(&script_pub_key_res);
        DecodeRawTransactionTxOut::~DecodeRawTransactionTxOut(&res_txout);
      }
      std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
                (&local_488);
      core::Transaction::~Transaction(&tx);
      std::__cxx11::string::~string((string *)&local_158);
      return;
    }
    res_txin.super_JsonClassBase<cfd::api::json::DecodeRawTransactionTxIn>._vptr_JsonClassBase =
         (_func_int **)0x500f39;
    res_txin.ignore_items._M_t._M_impl._0_4_ = 0x4b;
    res_txin.ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         (long)"ElementsDecodeRawTransaction" + 8;
    core::logger::warn<>
              ((CfdSourceLocation *)&res_txin,"Failed to DecodeRawTransactionRequest. hex empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&res_txin,"Invalid hex string. empty data.",(allocator *)&res_txout);
    core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&res_txin);
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&res_txin,"response is null.",(allocator *)&res_txout);
  core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&res_txin);
  __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void TransactionJsonApi::DecodeRawTransaction(
    DecodeRawTransactionRequest* request,
    DecodeRawTransactionResponse* response) {
  if (request == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "request is null.");
  }
  if (response == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "response is null.");
  }
  // validate version number
  const std::string& hex_string = request->GetHex();
  if (hex_string.empty()) {
    warn(
        CFD_LOG_SOURCE, "Failed to DecodeRawTransactionRequest. hex empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid hex string. empty data.");
  }
  // TODO(k-matsuzawa): iswitness未使用。bitcoincoreの指定方法が不明瞭

  NetType net_type = ConvertNetType(request->GetNetwork());

  // TransactionController作成
  Transaction tx(hex_string);

  response->SetTxid(tx.GetTxid().GetHex());
  response->SetHash(Txid(tx.GetWitnessHash()).GetHex());
  response->SetSize(tx.GetTotalSize());
  response->SetVsize(tx.GetVsize());
  response->SetWeight(tx.GetWeight());
  response->SetVersion(tx.GetVersion());
  response->SetLocktime(tx.GetLockTime());

  // TxInの追加
  for (const TxInReference& tx_in_ref : tx.GetTxInList()) {
    DecodeRawTransactionTxIn res_txin;
    if (tx.IsCoinBase()) {
      res_txin.SetIgnoreItem("txid");
      res_txin.SetIgnoreItem("vout");
      res_txin.SetIgnoreItem("scriptSig");
      res_txin.SetIgnoreItem("txinwitness");

      if (!tx_in_ref.GetUnlockingScript().IsEmpty()) {
        res_txin.SetCoinbase(tx_in_ref.GetUnlockingScript().GetHex());
      }
    } else {
      res_txin.SetIgnoreItem("coinbase");

      res_txin.SetTxid(tx_in_ref.GetTxid().GetHex());
      res_txin.SetVout(tx_in_ref.GetVout());
      if (!tx_in_ref.GetUnlockingScript().IsEmpty()) {
        res_txin.GetScriptSig().SetAsm(tx_in_ref.GetUnlockingScript().ToString());
        res_txin.GetScriptSig().SetHex(tx_in_ref.GetUnlockingScript().GetHex());
      }
      for (const ByteData& witness :
           tx_in_ref.GetScriptWitness().GetWitness()) {  // NOLINT
        res_txin.GetTxinwitness().push_back(witness.GetHex());
      }
      if (res_txin.GetTxinwitness().empty()) {
        // txinwitnessを除外
        res_txin.SetIgnoreItem("txinwitness");
      }
    }
    res_txin.SetSequence(tx_in_ref.GetSequence());
    response->GetVin().push_back(res_txin);
  }

  // TxOutの追加
  int32_t txout_count = 0;
  for (const TxOutReference& txout_ref : tx.GetTxOutList()) {
    DecodeRawTransactionTxOut res_txout;
    res_txout.SetValue(txout_ref.GetValue().GetSatoshiValue());
    res_txout.SetN(txout_count);

    DecodeLockingScript script_pub_key_res;
    std::vector<std::string> addresses;
    Script locking_script = txout_ref.GetLockingScript();
    script_pub_key_res.SetHex(locking_script.GetHex());
    script_pub_key_res.SetAsm(locking_script.ToString());

    AddressFactory addr_factory(net_type);
    int64_t require_num = 0;
    std::string script_type;
    auto addr_list = TransactionJsonApi::ConvertFromLockingScript(
        addr_factory, locking_script, &script_type, &require_num);
    script_pub_key_res.SetType(script_type);
    script_pub_key_res.SetReqSigs(require_num);
    if (addr_list.empty()) {
      script_pub_key_res.SetIgnoreItem("reqSigs");
      script_pub_key_res.SetIgnoreItem("addresses");
    } else {
      for (auto addr : addr_list) {
        script_pub_key_res.GetAddresses().push_back(addr.GetAddress());
      }
    }
    res_txout.SetScriptPubKey(script_pub_key_res);

    response->GetVout().push_back(res_txout);
    ++txout_count;
  }
}